

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OstreamSupport.cpp
# Opt level: O3

ostream * operator<<(ostream *out,List<MiniScript::String> *rhs)

{
  long lVar1;
  String *rhs_00;
  ListStorage<MiniScript::String> *pLVar2;
  long lVar3;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_32,1);
  pLVar2 = rhs->ls;
  if (pLVar2 != (ListStorage<MiniScript::String> *)0x0) {
    lVar1 = 0;
    lVar3 = 0;
    do {
      if ((long)(pLVar2->super_SimpleVector<MiniScript::String>).mQtyItems <= lVar3) break;
      if (lVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        pLVar2 = rhs->ls;
        if (pLVar2 == (ListStorage<MiniScript::String> *)0x0) {
          MiniScript::_Error("Assert failed: ls",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                             ,0x3c);
          pLVar2 = rhs->ls;
        }
      }
      if (lVar3 < (long)(pLVar2->super_SimpleVector<MiniScript::String>).mQtyItems) {
        rhs_00 = (String *)
                 ((long)&((pLVar2->super_SimpleVector<MiniScript::String>).mBuf)->ss + lVar1);
      }
      else {
        MiniScript::_Error("invalid index in SimpleVector::operator[]",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                           ,0xc1);
        rhs_00 = (pLVar2->super_SimpleVector<MiniScript::String>).mBuf;
      }
      operator<<(out,rhs_00);
      lVar3 = lVar3 + 1;
      pLVar2 = rhs->ls;
      lVar1 = lVar1 + 0x10;
    } while (pLVar2 != (ListStorage<MiniScript::String> *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_31,1);
  return out;
}

Assistant:

ostream & operator<< (ostream &out, const List<String> &rhs) {
	out << '[';
	for (int i=0; i<rhs.Count(); i++) {
		if (i > 0) out << ", ";
		out << rhs[i];
	}
	out << ']';
	return out;
}